

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void DataTypeApplyOp(ImGuiDataType data_type,int op,void *value1,void *value2)

{
  void *value2_local;
  void *value1_local;
  int op_local;
  ImGuiDataType data_type_local;
  
  if (data_type == ImGuiDataType_Int) {
    if (op == 0x2b) {
      *(int *)value1 = *value1 + *value2;
    }
    else if (op == 0x2d) {
      *(int *)value1 = *value1 - *value2;
    }
  }
  else if (data_type == ImGuiDataType_Float) {
    if (op == 0x2b) {
      *(float *)value1 = *value1 + *value2;
    }
    else if (op == 0x2d) {
      *(float *)value1 = *value1 - *value2;
    }
  }
  return;
}

Assistant:

static void DataTypeApplyOp(ImGuiDataType data_type, int op, void* value1, const void* value2)// Store into value1
{
    if (data_type == ImGuiDataType_Int)
    {
        if (op == '+')
            *(int*)value1 = *(int*)value1 + *(const int*)value2;
        else if (op == '-')
            *(int*)value1 = *(int*)value1 - *(const int*)value2;
    }
    else if (data_type == ImGuiDataType_Float)
    {
        if (op == '+')
            *(float*)value1 = *(float*)value1 + *(const float*)value2;
        else if (op == '-')
            *(float*)value1 = *(float*)value1 - *(const float*)value2;
    }
}